

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_newCallStartsWhileNotAllParametersWerePassed_Test::
TEST_MockParameterTest_newCallStartsWhileNotAllParametersWerePassed_Test
          (TEST_MockParameterTest_newCallStartsWhileNotAllParametersWerePassed_Test *this)

{
  TEST_MockParameterTest_newCallStartsWhileNotAllParametersWerePassed_Test *this_local;
  
  memset(this,0,8);
  TEST_GROUP_CppUTestGroupMockParameterTest::TEST_GROUP_CppUTestGroupMockParameterTest
            (&this->super_TEST_GROUP_CppUTestGroupMockParameterTest);
  (this->super_TEST_GROUP_CppUTestGroupMockParameterTest).super_Utest._vptr_Utest =
       (_func_int **)
       &PTR__TEST_MockParameterTest_newCallStartsWhileNotAllParametersWerePassed_Test_003595c0;
  return;
}

Assistant:

TEST(MockParameterTest, newCallStartsWhileNotAllParametersWerePassed)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->withParameter("p1", 1);
    MockExpectedParameterDidntHappenFailure expectedFailure(mockFailureTest(), "foo", expectations, expectations);

    mock().expectOneCall("foo").withParameter("p1", 1);
    mock().actualCall("foo");
    mock().actualCall("foo").withParameter("p1", 1);

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}